

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O2

void cleanupListExtras(atom *alst,xformDatabase *xdb,abrAtomListProc *delAtomProc,void *deletestuff)

{
  atom *paVar1;
  atom_t *paVar2;
  xformAtomRecords *pxVar3;
  atom *paVar4;
  atom *paVar5;
  
  paVar2 = alst;
  if (xdb == (xformDatabase *)0x0 || alst == (atom *)0x0) {
    return;
  }
  for (; paVar2 != (atom *)0x0; paVar2 = paVar2->next) {
    paVar2->mark = 1;
  }
  while (xdb = (xformDatabase *)((transformData *)xdb)->next,
        (transformData *)xdb != (transformData *)0x0) {
    pxVar3 = (xformAtomRecords *)&((transformData *)xdb)->recs;
    while (pxVar3 = pxVar3->next, pxVar3 != (xformAtomRecords *)0x0) {
      pxVar3->a->mark = 0;
    }
  }
  do {
    paVar1 = (atom *)0x0;
    while( true ) {
      do {
        paVar5 = alst;
        paVar4 = paVar1;
        if (paVar5 == (atom *)0x0) {
          return;
        }
        alst = paVar5->next;
        paVar1 = paVar5;
      } while (paVar5->mark == 0);
      (*delAtomProc)(paVar5,deletestuff);
      if (paVar4 == (atom *)0x0) break;
      paVar4->next = alst;
      paVar1 = paVar4;
    }
  } while( true );
}

Assistant:

void cleanupListExtras(atom *alst, xformDatabase* xdb,
            abrAtomListProc delAtomProc, void *deletestuff) {

   atom *a = NULL, *prev= NULL, *next = NULL;
   transformData *xform = NULL;
   xformAtomRecords *xa = NULL;

   if (alst && xdb) {
      /* mark everything in the atom list */
      for(a = alst; a; a = a->next) {
	 a->mark = 1;
      }

      /* unmark atoms reachable from the transformation database */
      for(xform = xdb->xforms; xform; xform = xform->next) {
	 for(xa = xform->recs; xa; xa = xa->next) {
	    xa->a->mark = 0;
	 }
      }

      /* if still marked - must be extra - delete it */
      prev = NULL;
      for(a = alst; a; a = next) {
	 next = a->next;
	 if (a->mark) {
	    delAtomProc(a, deletestuff);
	    if (prev) { prev->next = next; }
	 }
	 else { prev = a; }
      }
   }
}